

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

bool __thiscall
capnp::InterfaceSchema::extends(InterfaceSchema *this,InterfaceSchema other,uint *counter)

{
  uint uVar1;
  Schema SVar2;
  bool bVar3;
  uint64_t id;
  unsigned_long i;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  Reader superclass;
  Reader superclasses;
  Schema local_c0;
  StructReader local_b8;
  PointerReader local_88;
  ListReader local_68;
  
  uVar1 = *counter;
  *counter = uVar1 + 1;
  if (uVar1 < 0x40) {
    SVar2.raw = (this->super_Schema).raw;
    if ((Schema)SVar2.raw == other.super_Schema.raw) {
      bVar6 = true;
    }
    else {
      local_68.ptr = (byte *)(SVar2.raw)->generic->encodedNode;
      local_68.segment = (SegmentReader *)0x0;
      local_68.capTable = (CapTableReader *)0x0;
      local_68.elementCount = 0x7fffffff;
      _::PointerReader::getStruct(&local_b8,(PointerReader *)&local_68,(word *)0x0);
      local_88.pointer = (WirePointer *)0x0;
      local_88.segment = (SegmentReader *)(RawBrandedSchema *)0x0;
      local_88.capTable = (CapTableReader *)0x0;
      local_88.nestingLimit = 0x7fffffff;
      if (4 < local_b8.pointerCount) {
        local_88.pointer = local_b8.pointers + 4;
        local_88.segment = local_b8.segment;
        local_88.capTable = local_b8.capTable;
        local_88.nestingLimit = local_b8.nestingLimit;
      }
      _::PointerReader::getList(&local_68,&local_88,INLINE_COMPOSITE,(word *)0x0);
      uVar5 = (ulong)local_68.elementCount;
      bVar6 = uVar5 != 0;
      if (bVar6) {
        uVar4 = 0;
        do {
          _::ListReader::getStructElement(&local_b8,&local_68,(ElementCount)uVar4);
          if (local_b8.dataSize < 0x40) {
            id = 0;
          }
          else {
            id = *local_b8.data;
          }
          local_c0 = Schema::getDependency(&this->super_Schema,id,(ElementCount)uVar4 | 0x4000000);
          local_88.segment = (SegmentReader *)Schema::asInterface(&local_c0);
          bVar3 = extends((InterfaceSchema *)&local_88,other,counter);
          if (bVar3) {
            return bVar6;
          }
          uVar4 = uVar4 + 1;
          bVar6 = uVar5 != uVar4;
        } while (bVar6);
      }
    }
  }
  else {
    extends();
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool InterfaceSchema::extends(InterfaceSchema other, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return false;
  }

  if (other == *this) {
    return true;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    if (getDependency(superclass.getId(), location).asInterface().extends(other, counter)) {
      return true;
    }
  }

  return false;
}